

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::copy_make_border
               (Mat *src,Mat *dst,int top,int bottom,int left,int right,int type,float v)

{
  int iVar1;
  int _w;
  int _c;
  Mat m;
  Mat borderm;
  
  if (right + left == 0 && bottom + top == 0) {
    Mat::operator=(dst,src);
    return;
  }
  _w = right + left + src->w;
  iVar1 = bottom + top + src->h;
  if (src->dims == 3) {
    _c = src->c;
    Mat::create(dst,_w,iVar1,_c,4);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      iVar1 = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (; _c != iVar1; iVar1 = iVar1 + 1) {
        Mat::channel(&m,src,iVar1);
        Mat::channel(&borderm,dst,iVar1);
        copy_make_border_image(&m,&borderm,top,left,type,v);
        Mat::~Mat(&borderm);
        Mat::~Mat(&m);
      }
    }
  }
  else if (src->dims == 2) {
    Mat::create(dst,_w,iVar1,4);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      copy_make_border_image(src,dst,top,left,type,v);
      return;
    }
  }
  return;
}

Assistant:

void copy_make_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int type, float v)
{
    int w = src.w + left + right;
    int h = src.h + top + bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_make_border_image(src, dst, top, left, type, v);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat borderm = dst.channel(q);

            copy_make_border_image(m, borderm, top, left, type, v);
        }
    }
}